

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O0

int ompt_get_place_num(void)

{
  int iVar1;
  kmp_info_t *pkVar2;
  kmp_info_t *thread;
  int gtid;
  
  if ((((ulong)ompt_enabled & 1) == 0) || (iVar1 = __kmp_get_global_thread_id(), iVar1 < 0)) {
    return -1;
  }
  if (__kmp_affin_mask_size == 0) {
    return -1;
  }
  iVar1 = __kmp_get_global_thread_id_reg();
  pkVar2 = __kmp_thread_from_gtid(iVar1);
  if ((pkVar2 != (kmp_info_t *)0x0) && (-1 < (pkVar2->th).th_current_place)) {
    return (pkVar2->th).th_current_place;
  }
  return -1;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_place_num(void) {
// copied from kmp_ftn_entry.h (but modified)
#if !KMP_AFFINITY_SUPPORTED
  return -1;
#else
  if (!ompt_enabled.enabled || __kmp_get_gtid() < 0)
    return -1;

  int gtid;
  kmp_info_t *thread;
  if (!KMP_AFFINITY_CAPABLE())
    return -1;
  gtid = __kmp_entry_gtid();
  thread = __kmp_thread_from_gtid(gtid);
  if (thread == NULL || thread->th.th_current_place < 0)
    return -1;
  return thread->th.th_current_place;
#endif
}